

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::setString
          (Message *this,string *string,bool doValidation,DataDictionary *pSessionDataDictionary,
          DataDictionary *pApplicationDataDictionary)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  InvalidMessage *this_00;
  FieldMap *pFVar6;
  string *psVar7;
  long lVar8;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  undefined1 local_13a;
  allocator<char> local_139;
  string local_138;
  undefined1 local_108 [8];
  FieldBase field;
  undefined1 local_a0 [4];
  field_type type;
  MsgType msg;
  ulong uStack_38;
  int count;
  size_type pos;
  DataDictionary *pApplicationDataDictionary_local;
  DataDictionary *pSessionDataDictionary_local;
  string *psStack_18;
  bool doValidation_local;
  string *string_local;
  Message *this_local;
  
  pos = (size_type)pApplicationDataDictionary;
  pApplicationDataDictionary_local = pSessionDataDictionary;
  pSessionDataDictionary_local._7_1_ = doValidation;
  psStack_18 = string;
  string_local = (string *)this;
  clear(this);
  uStack_38 = 0;
  msg.super_StringField.super_FieldBase.m_metrics._12_4_ = 0;
  MsgType::MsgType((MsgType *)local_a0);
  field.m_metrics._12_4_ = 0;
  do {
    uVar1 = uStack_38;
    uVar5 = std::__cxx11::string::size();
    if (uVar5 <= uVar1) {
      FieldMap::sortFields(&(this->m_header).super_FieldMap);
      FieldMap::sortFields(&this->super_FieldMap);
      FieldMap::sortFields(&(this->m_trailer).super_FieldMap);
      if ((pSessionDataDictionary_local._7_1_ & 1) != 0) {
        validate(this);
      }
      MsgType::~MsgType((MsgType *)local_a0);
      return;
    }
    extractField((FieldBase *)local_108,this,psStack_18,&stack0xffffffffffffffc8,
                 pApplicationDataDictionary_local,(DataDictionary *)pos,(Group *)0x0);
    if ((int)msg.super_StringField.super_FieldBase.m_metrics._12_4_ < 3) {
      lVar8 = (long)(int)msg.super_StringField.super_FieldBase.m_metrics._12_4_;
      msg.super_StringField.super_FieldBase.m_metrics._12_4_ =
           msg.super_StringField.super_FieldBase.m_metrics._12_4_ + 1;
      iVar4 = *(int *)(headerOrder + lVar8 * 4);
      iVar3 = FieldBase::getTag((FieldBase *)local_108);
      if ((iVar4 != iVar3) && ((pSessionDataDictionary_local._7_1_ & 1) != 0)) {
        local_13a = 1;
        this_00 = (InvalidMessage *)__cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"Header fields out of order",&local_139);
        InvalidMessage::InvalidMessage(this_00,&local_138);
        local_13a = 0;
        __cxa_throw(this_00,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
      }
    }
    bVar2 = isHeaderField((FieldBase *)local_108,pApplicationDataDictionary_local);
    if (bVar2) {
      if (field.m_metrics._12_4_ != 0) {
        if (this->m_tag == 0) {
          iVar4 = FieldBase::getTag((FieldBase *)local_108);
          this->m_tag = iVar4;
        }
        this->m_validStructure = false;
      }
      iVar4 = FieldBase::getTag((FieldBase *)local_108);
      if (iVar4 == 0x23) {
        psVar7 = FieldBase::getString_abi_cxx11_((FieldBase *)local_108);
        FieldBase::setString((FieldBase *)local_a0,psVar7);
        bVar2 = isAdminMsgType((MsgType *)local_a0);
        if (bVar2) {
          pos = (size_type)pApplicationDataDictionary_local;
        }
      }
      FieldMap::appendField(&(this->m_header).super_FieldMap,(FieldBase *)local_108);
      if (pApplicationDataDictionary_local != (DataDictionary *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"_header_",&local_161);
        psVar7 = psStack_18;
        pFVar6 = &getHeader(this)->super_FieldMap;
        setGroup(this,&local_160,(FieldBase *)local_108,psVar7,&stack0xffffffffffffffc8,pFVar6,
                 pApplicationDataDictionary_local);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
      }
    }
    else {
      bVar2 = isTrailerField((FieldBase *)local_108,pApplicationDataDictionary_local);
      if (bVar2) {
        field.m_metrics._12_4_ = 2;
        FieldMap::appendField(&(this->m_trailer).super_FieldMap,(FieldBase *)local_108);
        if (pApplicationDataDictionary_local != (DataDictionary *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,"_trailer_",&local_189);
          psVar7 = psStack_18;
          pFVar6 = &getTrailer(this)->super_FieldMap;
          setGroup(this,&local_188,(FieldBase *)local_108,psVar7,&stack0xffffffffffffffc8,pFVar6,
                   pApplicationDataDictionary_local);
          std::__cxx11::string::~string((string *)&local_188);
          std::allocator<char>::~allocator(&local_189);
        }
      }
      else {
        if (field.m_metrics._12_4_ == 2) {
          if (this->m_tag == 0) {
            iVar4 = FieldBase::getTag((FieldBase *)local_108);
            this->m_tag = iVar4;
          }
          this->m_validStructure = false;
        }
        field.m_metrics._12_4_ = 1;
        FieldMap::appendField(&this->super_FieldMap,(FieldBase *)local_108);
        if (pos != 0) {
          psVar7 = StringField::operator_cast_to_string_((StringField *)local_a0);
          setGroup(this,psVar7,(FieldBase *)local_108,psStack_18,&stack0xffffffffffffffc8,
                   &this->super_FieldMap,(DataDictionary *)pos);
        }
      }
    }
    FieldBase::~FieldBase((FieldBase *)local_108);
  } while( true );
}

Assistant:

void Message::setString( const std::string& string,
                         bool doValidation,
                         const DataDictionary* pSessionDataDictionary,
                         const DataDictionary* pApplicationDataDictionary )
EXCEPT ( InvalidMessage )
{
  clear();

  std::string::size_type pos = 0;
  int count = 0;

  FIX::MsgType msg;

  field_type type = header;

  while ( pos < string.size() )
  {
    FieldBase field = extractField( string, pos, pSessionDataDictionary, pApplicationDataDictionary );
    if ( count < 3 && headerOrder[ count++ ] != field.getTag() )
      if ( doValidation ) throw InvalidMessage("Header fields out of order");

    if ( isHeaderField( field, pSessionDataDictionary ) )
    {
      if ( type != header )
      {
        if(m_tag == 0) m_tag = field.getTag();
        m_validStructure = false;
      }

      if ( field.getTag() == FIELD::MsgType )
      {
        msg.setString( field.getString() );
        if ( isAdminMsgType( msg ) )
        {
          pApplicationDataDictionary = pSessionDataDictionary;
#ifdef HAVE_EMX
          m_subMsgType.assign(msg);
        }
        else
        {
          std::string::size_type equalSign = string.find("\0019426=", pos);
          if (equalSign == std::string::npos)
            throw InvalidMessage("EMX message type (9426) not found");

          equalSign += 6;
          std::string::size_type soh = string.find_first_of('\001', equalSign);
          if (soh == std::string::npos)
            throw InvalidMessage("EMX message type (9426) soh char not found");
          m_subMsgType.assign(string.substr(equalSign, soh - equalSign ));
#endif
        }
      }

      m_header.appendField( field );

      if ( pSessionDataDictionary )
        setGroup( "_header_", field, string, pos, getHeader(), *pSessionDataDictionary );
    }
    else if ( isTrailerField( field, pSessionDataDictionary ) )
    {
      type = trailer;
      m_trailer.appendField( field );

      if ( pSessionDataDictionary )
        setGroup( "_trailer_", field, string, pos, getTrailer(), *pSessionDataDictionary );
    }
    else
    {
      if ( type == trailer )
      {
        if(m_tag == 0) m_tag = field.getTag();
        m_validStructure = false;
      }

      type = body;
      appendField( field );

      if ( pApplicationDataDictionary )
#ifdef HAVE_EMX
        setGroup(m_subMsgType, field, string, pos, *this, *pApplicationDataDictionary);
#else
        setGroup( msg, field, string, pos, *this, *pApplicationDataDictionary );
#endif
    }
  }

  // sort fields
  m_header.sortFields();
  sortFields();
  m_trailer.sortFields();

  if ( doValidation )
    validate();
}